

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_metadata.cc
# Opt level: O2

void __thiscall
draco::GeometryMetadata::GeometryMetadata(GeometryMetadata *this,GeometryMetadata *metadata)

{
  pointer puVar1;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> this_00;
  ulong uVar2;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> local_40;
  GeometryMetadata *local_38;
  
  Metadata::Metadata(&this->super_Metadata,&metadata->super_Metadata);
  (this->att_metadatas_).
  super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->att_metadatas_).
  super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->att_metadatas_).
  super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = this;
  for (uVar2 = 0;
      puVar1 = (metadata->att_metadatas_).
               super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(metadata->att_metadatas_).
                            super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00._M_head_impl = (AttributeMetadata *)operator_new(0x68);
    AttributeMetadata::AttributeMetadata
              (this_00._M_head_impl,
               (AttributeMetadata *)
               puVar1[uVar2]._M_t.
               super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               ._M_t);
    local_40._M_t.
    super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>.
    _M_t.
    super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
    .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
          )(__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
            )this_00._M_head_impl;
    std::
    vector<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>,std::allocator<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>>>
    ::
    emplace_back<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>>
              ((vector<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>,std::allocator<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>>>
                *)&this->att_metadatas_,&local_40);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    ~unique_ptr(&local_40);
  }
  return;
}

Assistant:

GeometryMetadata::GeometryMetadata(const GeometryMetadata &metadata)
    : Metadata(metadata) {
  for (size_t i = 0; i < metadata.att_metadatas_.size(); ++i) {
    att_metadatas_.push_back(std::unique_ptr<AttributeMetadata>(
        new AttributeMetadata(*metadata.att_metadatas_[i])));
  }
}